

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O2

string * Disassembler::procObj(string *__return_storage_ptr__,string *hex,int line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string *this;
  string resp;
  string local_168;
  string aux;
  string bin;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)hex);
  Conversion::hexToBin(&bin,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::substr((ulong)&aux,(ulong)&bin);
  paVar1 = &resp.field_2;
  resp._M_string_length = 0;
  resp.field_2._M_local_buf[0] = '\0';
  resp._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string((string *)&local_68,(string *)&aux);
  iVar2 = AsmFuncts::getType(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (iVar2 == 2) {
    std::__cxx11::string::string((string *)&local_88,(string *)&bin);
    iType(&local_168,&local_88,line);
    std::__cxx11::string::operator=((string *)&resp,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    this = &local_88;
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,(string *)&aux);
    iVar2 = AsmFuncts::getType(&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (iVar2 == 1) {
      std::__cxx11::string::string((string *)&local_c8,(string *)&bin);
      rType(&local_168,&local_c8);
      std::__cxx11::string::operator=((string *)&resp,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      this = &local_c8;
    }
    else {
      std::__cxx11::string::string((string *)&local_e8,(string *)&aux);
      iVar2 = AsmFuncts::getType(&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      if (iVar2 != 3) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_168);
        goto LAB_0012d9a1;
      }
      std::__cxx11::string::string((string *)&local_108,(string *)&bin);
      jType(&local_168,&local_108);
      std::__cxx11::string::operator=((string *)&resp,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      this = &local_108;
    }
  }
  std::__cxx11::string::~string((string *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resp._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(resp.field_2._M_allocated_capacity._1_7_,resp.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = resp.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = resp._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(resp.field_2._M_allocated_capacity._1_7_,resp.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = resp._M_string_length;
  resp._M_string_length = 0;
  resp.field_2._M_local_buf[0] = '\0';
  resp._M_dataplus._M_p = (pointer)paVar1;
LAB_0012d9a1:
  std::__cxx11::string::~string((string *)&resp);
  std::__cxx11::string::~string((string *)&aux);
  std::__cxx11::string::~string((string *)&bin);
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::procObj(string hex, int line){
    string bin = Conversion::hexToBin(hex);
    string aux = bin.substr(0,6);
    string resp;
    if(AsmFuncts::getType(aux) == TYPE_I){
        resp = iType(bin, line);
        return resp;
    }
    if(AsmFuncts::getType(aux) == TYPE_R){
        resp = rType(bin);
        return resp;
    }
    if(AsmFuncts::getType(aux) == TYPE_J){
        resp = jType(bin);
        return resp;
    }
    return "";
}